

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.c
# Opt level: O2

_Bool COSE_Sign_validate(HCOSE_SIGN hSign,HCOSE_SIGNER hSigner,cose_errback *perr)

{
  _Bool _Var1;
  cn_cbor *pcborBody;
  cn_cbor *pcborProtected;
  
  _Var1 = IsValidSignHandle(hSign);
  if ((!_Var1) || (_Var1 = IsValidSignerHandle(hSigner), !_Var1)) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_HANDLE;
    }
    return false;
  }
  pcborBody = _COSE_arrayget_int((COSE *)hSign,2);
  if ((pcborBody != (cn_cbor *)0x0) &&
     (((pcborBody->type == CN_CBOR_BYTES &&
       (pcborProtected = _COSE_arrayget_int((COSE *)hSign,0), pcborProtected != (cn_cbor *)0x0)) &&
      (pcborProtected->type == CN_CBOR_BYTES)))) {
    _Var1 = _COSE_Signer_validate
                      ((COSE_SignMessage *)hSign,(COSE_SignerInfo *)hSigner,pcborBody,pcborProtected
                       ,perr);
    return _Var1;
  }
  if (perr == (cose_errback *)0x0) {
    return false;
  }
  perr->err = COSE_ERR_INVALID_PARAMETER;
  return false;
}

Assistant:

bool COSE_Sign_validate(HCOSE_SIGN hSign, HCOSE_SIGNER hSigner, cose_errback * perr)
{
	bool f;
	COSE_SignMessage * pSign;
	COSE_SignerInfo * pSigner;
	const cn_cbor * cnContent;
	const cn_cbor * cnProtected;

	CHECK_CONDITION(IsValidSignHandle(hSign), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(IsValidSignerHandle(hSigner), COSE_ERR_INVALID_HANDLE);

	pSign = (COSE_SignMessage *)hSign;
	pSigner = (COSE_SignerInfo *)hSigner;

	cnContent = _COSE_arrayget_int(&pSign->m_message, INDEX_BODY);
	CHECK_CONDITION(cnContent != NULL && cnContent->type == CN_CBOR_BYTES, COSE_ERR_INVALID_PARAMETER);

	cnProtected = _COSE_arrayget_int(&pSign->m_message, INDEX_PROTECTED);
	CHECK_CONDITION(cnProtected != NULL && cnProtected->type == CN_CBOR_BYTES, COSE_ERR_INVALID_PARAMETER);

	f = _COSE_Signer_validate(pSign, pSigner, cnContent, cnProtected, perr);

	return f;

errorReturn:
	return false;
}